

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::MessageSize<google::protobuf::MessageLite>
                 (MessageLite *value)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  MessageLite *value_local;
  
  iVar1 = (*value->_vptr_MessageLite[3])();
  sVar2 = LengthDelimitedSize(CONCAT44(extraout_var,iVar1));
  return sVar2;
}

Assistant:

inline size_t WireFormatLite::MessageSize(const MessageType& value) {
  return LengthDelimitedSize(value.ByteSizeLong());
}